

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::Extent>::add_sample
          (TypedTimeSamples<tinyusdz::Extent> *this,double t,Extent *v)

{
  Sample local_30;
  
  local_30.blocked = false;
  local_30.value.lower._M_elems._0_8_ = *(undefined8 *)(v->lower)._M_elems;
  local_30.value._8_8_ = *(undefined8 *)((v->lower)._M_elems + 2);
  local_30.value.upper._M_elems._4_8_ = *(undefined8 *)((v->upper)._M_elems + 1);
  local_30.t = t;
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>>
              *)this,&local_30);
  this->_dirty = true;
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }